

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O2

rb_result_t rb_tree_find(rb_tree *tree,void *key,rb_tree_node **value)

{
  int iVar1;
  rb_tree_node *prVar2;
  
  if (tree == (rb_tree *)0x0) {
    __assert_fail("\"tree != NULL\" && 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/deps/rbtree/rbtree.c"
                  ,0x83,
                  "rb_result_t rb_tree_find(struct rb_tree *, const void *, struct rb_tree_node **)"
                 );
  }
  if (value != (rb_tree_node **)0x0) {
    *value = (rb_tree_node *)0x0;
    prVar2 = tree->root;
    if (prVar2 != (rb_tree_node *)0x0) {
      for (; prVar2 != (rb_tree_node *)0x0; prVar2 = prVar2->left) {
        iVar1 = (*tree->compare)(tree->state,key,prVar2->key);
        if (-1 < iVar1) {
          if (iVar1 == 0) {
            *value = prVar2;
            return 0;
          }
          prVar2 = (rb_tree_node *)&prVar2->right;
        }
      }
    }
    return 1;
  }
  __assert_fail("\"value != NULL\" && 0",
                "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/deps/rbtree/rbtree.c"
                ,0x84,
                "rb_result_t rb_tree_find(struct rb_tree *, const void *, struct rb_tree_node **)");
}

Assistant:

rb_result_t rb_tree_find(struct rb_tree *tree,
                         const void *key,
                         struct rb_tree_node **value)
{
    rb_result_t ret = RB_OK;

    RB_ASSERT_ARG(tree != NULL);
    RB_ASSERT_ARG(value != NULL);

    *value = NULL;

    if (RB_UNLIKELY(tree->root == NULL)) {
        ret = RB_NOT_FOUND;
        goto done;
    }

    struct rb_tree_node *node = tree->root;

    while (node != NULL) {
        int compare = tree->compare(tree->state, key, node->key);

        if (compare < 0) {
            node = node->left;
        } else if (compare == 0) {
            break; /* We found our node */
        } else {
            /* Otherwise, we want the right node, and continue iteration */
            node = node->right;
        }
    }

    if (node == NULL) {
        ret = RB_NOT_FOUND;
        goto done;
    }

    /* Return the node we found */
    *value = node;

done:
    return ret;
}